

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_hashmap.h
# Opt level: O1

void __thiscall
v_hashmap<substring,_unsigned_long>::double_size(v_hashmap<substring,_unsigned_long> *this)

{
  substring *psVar1;
  uint64_t uVar2;
  char *pcVar3;
  hash_elem *phVar4;
  v_array<v_hashmap<substring,_unsigned_long>::hash_elem> *__range2;
  hash_elem *e;
  hash_elem *phVar5;
  v_array<v_hashmap<substring,_unsigned_long>::hash_elem> tmp;
  v_array<v_hashmap<substring,_unsigned_long>::hash_elem> local_48;
  
  local_48.end_array = (hash_elem *)0x0;
  local_48.erase_count = 0;
  local_48._begin = (hash_elem *)0x0;
  local_48._end = (hash_elem *)0x0;
  v_array<v_hashmap<substring,_unsigned_long>::hash_elem>::resize
            (&local_48,this->num_occupants + 10);
  phVar5 = (this->dat)._begin;
  phVar4 = (this->dat).end_array;
  if (phVar5 != phVar4) {
    do {
      if (phVar5->occupied == true) {
        v_array<v_hashmap<substring,_unsigned_long>::hash_elem>::push_back(&local_48,phVar5);
      }
      phVar5 = phVar5 + 1;
      phVar4 = (this->dat).end_array;
    } while (phVar5 != phVar4);
  }
  v_array<v_hashmap<substring,_unsigned_long>::hash_elem>::resize
            (&this->dat,((long)phVar4 - (long)(this->dat)._begin >> 3) * -0x6666666666666666);
  phVar5 = (this->dat)._begin;
  memset(phVar5,0,(long)(this->dat).end_array - (long)phVar5);
  phVar5 = local_48._end;
  for (phVar4 = local_48._begin; phVar4 != phVar5; phVar4 = phVar4 + 1) {
    get(this,&phVar4->key,phVar4->hash);
    uVar2 = phVar4->hash;
    (this->dat)._begin[this->last_position].occupied = true;
    pcVar3 = (phVar4->key).end;
    psVar1 = &(this->dat)._begin[this->last_position].key;
    psVar1->begin = (phVar4->key).begin;
    psVar1->end = pcVar3;
    (this->dat)._begin[this->last_position].val = phVar4->val;
    (this->dat)._begin[this->last_position].hash = uVar2;
  }
  if (local_48._begin != (hash_elem *)0x0) {
    free(local_48._begin);
  }
  return;
}

Assistant:

void double_size()
  {  //    printf("doubling size!\n");
    // remember the old occupants
    v_array<hash_elem> tmp = v_array<hash_elem>();
    tmp.resize(num_occupants + 10);
    for (hash_elem* e = dat.begin(); e != dat.end_array; e++)
      if (e->occupied)
        tmp.push_back(*e);

    // double the size and clear
    // std::cerr<<"doubling to "<<(base_size()*2) << " units == " << (base_size()*2*sizeof(hash_elem)) << " bytes / " <<
    // ((size_t)-1)<<std::endl;
    dat.resize(base_size() * 2);
    memset(dat.begin(), 0, base_size() * sizeof(hash_elem));

    // re-insert occupants
    for (auto& e : tmp)
    {
      get(e.key, e.hash);
      //      std::cerr << "reinserting " << e->key << " at " << last_position << std::endl;
      put_after_get_nogrow(e.key, e.hash, e.val);
    }
    tmp.delete_v();
  }